

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O2

bool __thiscall QFontDialog::eventFilter(QFontDialog *this,QObject *o,QEvent *e)

{
  long lVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  QStyle *pQVar6;
  QLineEdit *this_00;
  
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  sVar3 = *(short *)(e + 8);
  if (sVar3 == 8) {
    pQVar6 = QWidget::style((QWidget *)this);
    iVar4 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0xd,0,this,0);
    if (iVar4 != 0) {
      if (*(QObject **)(lVar1 + 0x2f0) == o) {
        this_00 = *(QLineEdit **)(lVar1 + 0x2e8);
      }
      else if (*(QObject **)(lVar1 + 0x308) == o) {
        this_00 = *(QLineEdit **)(lVar1 + 0x300);
      }
      else {
        if (*(QObject **)(lVar1 + 800) != o) goto LAB_004b3202;
        this_00 = *(QLineEdit **)(lVar1 + 0x318);
      }
      QLineEdit::selectAll(this_00);
      goto LAB_004b3202;
    }
    sVar3 = *(short *)(e + 8);
  }
  else if (sVar3 == 6) {
    if (((*(QObject **)(lVar1 + 0x318) == o) && (*(int *)(e + 0x40) + 0xfeffffedU < 5)) &&
       (*(int *)(e + 0x40) + 0xfeffffedU != 1)) {
      iVar4 = QFontListView::currentItem(*(QFontListView **)(lVar1 + 800));
      QCoreApplication::sendEvent(*(QObject **)(lVar1 + 800),e);
      iVar5 = QFontListView::currentItem(*(QFontListView **)(lVar1 + 800));
      if (iVar4 != iVar5) {
        pQVar6 = QWidget::style((QWidget *)this);
        iVar4 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0xd,0,this,0);
        if (iVar4 != 0) {
          QLineEdit::selectAll(*(QLineEdit **)(lVar1 + 0x318));
        }
      }
    }
    else {
      if (((*(QObject **)(lVar1 + 0x2f0) != o) && (*(QObject **)(lVar1 + 0x308) != o)) ||
         ((*(uint *)(e + 0x40) & 0xfffffffe) != 0x1000004)) goto LAB_004b3202;
      e[0xc] = (QEvent)0x1;
      (**(code **)(*(long *)&(this->super_QDialog).super_QWidget + 0x1b8))(this);
    }
    return true;
  }
  if ((sVar3 == 2) && (*(QObject **)(lVar1 + 800) == o)) {
    QWidget::setFocus(*(QWidget **)(lVar1 + 0x318));
  }
LAB_004b3202:
  bVar2 = QDialog::eventFilter(&this->super_QDialog,o,e);
  return bVar2;
}

Assistant:

bool QFontDialog::eventFilter(QObject *o , QEvent *e)
{
    Q_D(QFontDialog);
    if (e->type() == QEvent::KeyPress) {
        QKeyEvent *k = static_cast<QKeyEvent *>(e);
        if (o == d->sizeEdit &&
        (k->key() == Qt::Key_Up ||
             k->key() == Qt::Key_Down ||
         k->key() == Qt::Key_PageUp ||
         k->key() == Qt::Key_PageDown)) {

            int ci = d->sizeList->currentItem();
            QCoreApplication::sendEvent(d->sizeList, k);

            if (ci != d->sizeList->currentItem()
                    && style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, this))
                d->sizeEdit->selectAll();
            return true;
        } else if ((o == d->familyList || o == d->styleList) &&
                    (k->key() == Qt::Key_Return || k->key() == Qt::Key_Enter)) {
            k->accept();
        accept();
            return true;
        }
    } else if (e->type() == QEvent::FocusIn
               && style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, this)) {
        if (o == d->familyList)
            d->familyEdit->selectAll();
        else if (o == d->styleList)
            d->styleEdit->selectAll();
        else if (o == d->sizeList)
            d->sizeEdit->selectAll();
    } else if (e->type() == QEvent::MouseButtonPress && o == d->sizeList) {
            d->sizeEdit->setFocus();
    }
    return QDialog::eventFilter(o, e);
}